

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O3

bool __thiscall QNetworkAccessCache::unlinkEntry(QNetworkAccessCache *this,QByteArray *key)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node<QByteArray,_QNetworkAccessCache::Node_*> *pNVar5;
  
  if (((*(Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> **)(this + 0x10) !=
        (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0) &&
      (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::
                findNode<QByteArray>
                          (*(Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> **)
                            (this + 0x10),key),
      pNVar5 != (Node<QByteArray,_QNetworkAccessCache::Node_*> *)0x0)) &&
     (pNVar1 = pNVar5->value, pNVar1 != (Node *)0x0)) {
    pNVar2 = *(Node **)(this + 0x18);
    if (pNVar1 == pNVar2) {
      *(Node **)(this + 0x18) = pNVar1->next;
    }
    pNVar3 = pNVar1->previous;
    if (pNVar1 == *(Node **)(this + 0x20)) {
      *(Node **)(this + 0x20) = pNVar3;
    }
    pNVar4 = pNVar1->next;
    if (pNVar3 != (Node *)0x0) {
      pNVar3->next = pNVar4;
    }
    if (pNVar4 != (Node *)0x0) {
      pNVar4->previous = pNVar3;
    }
    pNVar1->previous = (Node *)0x0;
    pNVar1->next = (Node *)0x0;
    return pNVar1 == pNVar2;
  }
  return false;
}

Assistant:

bool QNetworkAccessCache::unlinkEntry(const QByteArray &key)
{
    Node * const node = hash.value(key);
    if (!node)
        return false;

    bool wasFirst = false;
    if (node == firstExpiringNode) {
        firstExpiringNode = node->next;
        wasFirst = true;
    }
    if (node == lastExpiringNode)
        lastExpiringNode = node->previous;
    if (node->previous)
        node->previous->next = node->next;
    if (node->next)
        node->next->previous = node->previous;

    node->next = node->previous = nullptr;
    return wasFirst;
}